

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::
PlainTemplatedDefines<unsigned_short,duckdb::TemplatedParquetValueConversion<unsigned_int>,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  undefined2 uVar1;
  long lVar2;
  data_ptr_t pdVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  
  if (plain_data->len < num_values * 4) {
    PlainTemplatedInternal<unsigned_short,duckdb::TemplatedParquetValueConversion<unsigned_int>,false,true>
              (this,plain_data,defines,num_values,result_offset,result);
    return;
  }
  lVar2 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  if (result_offset < result_offset + num_values) {
    uVar4 = plain_data->len;
    uVar5 = 0;
    pdVar3 = plain_data->ptr;
    do {
      uVar4 = uVar4 - 4;
      uVar1 = *(undefined2 *)pdVar3;
      plain_data->len = uVar4;
      plain_data->ptr = pdVar3 + 4;
      *(undefined2 *)(lVar2 + result_offset * 2 + uVar5 * 2) = uVar1;
      uVar5 = uVar5 + 1;
      pdVar3 = pdVar3 + 4;
    } while (num_values != uVar5);
  }
  return;
}

Assistant:

void PlainTemplatedDefines(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                           Vector &result) {
		if (CONVERSION::PlainAvailable(plain_data, num_values)) {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, false>(plain_data, defines, num_values,
			                                                                   result_offset, result);
		} else {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, true>(plain_data, defines, num_values,
			                                                                  result_offset, result);
		}
	}